

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O3

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ktx::CommandCreate::scaleImage
          (CommandCreate *this,unique_ptr<Image,_std::default_delete<Image>_> *image,
          ktx_uint32_t width,ktx_uint32_t height)

{
  long *plVar1;
  Image *pIVar2;
  long *plVar3;
  unique_ptr<Image,_std::default_delete<Image>_> *puVar4;
  undefined4 in_register_00000014;
  long *plVar5;
  undefined4 in_R8D;
  long *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  plVar5 = (long *)CONCAT44(in_register_00000014,width);
  plVar1 = (long *)*plVar5;
  local_50[0] = local_40;
  puVar4 = image + 0x23;
  if (*(char *)&image[0x22]._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
                super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
                super__Head_base<0UL,_Image_*,_false>._M_head_impl != '\0') {
    puVar4 = image + 0x1e;
  }
  pIVar2 = (puVar4->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
           super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
           super__Head_base<0UL,_Image_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pIVar2,
             (long)&pIVar2->_vptr_Image +
             (long)&(puVar4[1]._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
                     super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
                     super__Head_base<0UL,_Image_*,_false>._M_head_impl)->_vptr_Image);
  (**(code **)(*plVar1 + 0x88))
            (*(undefined4 *)
              &image[(ulong)(*(byte *)((long)&image[0x27]._M_t.
                                              super___uniq_ptr_impl<Image,_std::default_delete<Image>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>
                                              .super__Head_base<0UL,_Image_*,_false>._M_head_impl +
                                      4) ^ 1) + 0x27]._M_t.
               super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
               super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
               super__Head_base<0UL,_Image_*,_false>._M_head_impl,&local_58,plVar1,height,in_R8D,
             local_50[0],
             *(undefined4 *)
              ((long)&image[(ulong)(*(byte *)&image[0x29]._M_t.
                                              super___uniq_ptr_impl<Image,_std::default_delete<Image>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>
                                              .super__Head_base<0UL,_Image_*,_false>._M_head_impl ^
                                   1) + 0x28]._M_t.
                      super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
                      super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
                      super__Head_base<0UL,_Image_*,_false>._M_head_impl + 4));
  plVar3 = local_58;
  local_58 = (long *)0x0;
  plVar1 = (long *)*plVar5;
  *plVar5 = (long)plVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 8))();
    }
  }
  local_58 = (long *)0x0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  (this->super_Command)._vptr_Command = (_func_int **)*plVar5;
  *plVar5 = 0;
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Image>
CommandCreate::scaleImage(std::unique_ptr<Image> image, ktx_uint32_t width, ktx_uint32_t height)
{
    try {
        image = image->resample(width, height,
                options.mipmapFilter.value_or(options.defaultMipmapFilter).c_str(),
                options.mipmapFilterScale.value_or(options.defaultMipmapFilterScale),
                options.mipmapWrap.value_or(options.defaultMipmapWrap));
    } catch (const std::exception& e) {
        fatal(rc::RUNTIME_ERROR, "Image resampling failed: {}", e.what());
    }
    return image;
}